

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_Split(SplitForm2 Split)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  bool bVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference this;
  code *in_RDI;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  size;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> outputIntensity;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> inputIntensity;
  anon_class_8_1_65350a3f in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  undefined2 in_stack_fffffffffffffcc4;
  uint8_t in_stack_fffffffffffffcc6;
  uint8_t in_stack_fffffffffffffcc7;
  uint32_t in_stack_fffffffffffffcc8;
  uint32_t in_stack_fffffffffffffccc;
  Image *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  uint32_t *in_stack_fffffffffffffd00;
  uint8_t uVar8;
  size_type __n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffd08;
  size_type __n_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffd10;
  uint32_t in_stack_fffffffffffffd18;
  uint32_t in_stack_fffffffffffffd1c;
  value_type vVar9;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  bool local_2a1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_170;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_158;
  pair<unsigned_int,_unsigned_int> local_13c;
  pair<unsigned_int,_unsigned_int> local_134;
  pair<unsigned_int,_unsigned_int> local_12c;
  pair<unsigned_int,_unsigned_int> local_124;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_118;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *local_100;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *local_f8;
  uchar *local_f0;
  uchar *local_e8;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_e0 [4];
  ImageTemplate<unsigned_char> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  code *local_38;
  
  local_38 = in_RDI;
  Unit_Test::intensityArray((uint32_t)((ulong)in_stack_fffffffffffffcb8.output >> 0x20));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_50,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8,
             in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc6);
  Test_Helper::uniformRGBImage
            ((uint8_t)((uint)in_stack_fffffffffffffcdc >> 0x18),in_stack_fffffffffffffcd0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e2fa3);
  PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_78);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_78);
  Unit_Test::fillImage
            ((Image *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18,
             (uint32_t)((ulong)in_stack_fffffffffffffd10 >> 0x20),
             (uint32_t)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  Unit_Test::intensityArray((uint32_t)((ulong)in_stack_fffffffffffffcb8.output >> 0x20));
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
            *)0x1e3022);
  local_e8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffffcb8.output);
  local_f0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffffcb8.output);
  __first._M_current._4_4_ = in_stack_fffffffffffffccc;
  __first._M_current._0_4_ = in_stack_fffffffffffffcc8;
  __last._M_current._4_2_ = in_stack_fffffffffffffcc4;
  __last._M_current._0_4_ = in_stack_fffffffffffffcc0;
  __last._M_current._6_1_ = in_stack_fffffffffffffcc6;
  __last._M_current._7_1_ = in_stack_fffffffffffffcc7;
  local_f8 = local_e0;
  local_100 = (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               *)std::
                 for_each<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,Function_Template::form2_Split(void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int))::__0>
                           (__first,__last,in_stack_fffffffffffffcb8);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)0x1e30b3);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
           CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
           (allocator_type *)in_stack_fffffffffffffcd0);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)0x1e30dc);
  local_124 = Unit_Test::imageSize((Image *)in_stack_fffffffffffffcb8.output);
  pvVar5 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](&local_118,0);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar5,&local_124);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](local_e0,0);
  local_12c = Unit_Test::imageSize((Image *)in_stack_fffffffffffffcb8.output);
  pvVar5 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](&local_118,1);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar5,&local_12c);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](local_e0,1);
  local_134 = Unit_Test::imageSize((Image *)in_stack_fffffffffffffcb8.output);
  pvVar5 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](&local_118,2);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar5,&local_134);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](local_e0,2);
  local_13c = Unit_Test::imageSize((Image *)in_stack_fffffffffffffcb8.output);
  pvVar5 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](&local_118,3);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar5,&local_13c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1e3264);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1e3279);
  Unit_Test::generateRoi
            ((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),in_stack_fffffffffffffd10
             ,(uint32_t *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  uVar8 = (uint8_t)((ulong)in_stack_fffffffffffffd00 >> 0x38);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_158,0);
  vVar9 = *pvVar6;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_170,0);
  vVar1 = *pvVar6;
  pvVar7 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](local_e0,0);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_158,1);
  vVar2 = *pvVar6;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_170,1);
  vVar3 = *pvVar6;
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](local_e0,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_158,2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_170,2);
  this = std::
         vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
         ::operator[](local_e0,2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_158,3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_170,3);
  (*local_38)(&local_78,vVar9,vVar1,pvVar7,vVar2,vVar3);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](local_e0,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_158,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_170,1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_50,0);
  bVar4 = Unit_Test::verifyImage
                    ((Image *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                     (uint32_t)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                     (uint32_t)in_stack_fffffffffffffd10,
                     (uint32_t)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                     (uint32_t)in_stack_fffffffffffffd08,uVar8);
  local_2a1 = false;
  if (bVar4) {
    std::
    vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ::operator[](local_e0,1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_158,2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_170,2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_50,1);
    bVar4 = Unit_Test::verifyImage
                      ((Image *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                       (uint32_t)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                       (uint32_t)in_stack_fffffffffffffd10,
                       (uint32_t)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                       (uint32_t)in_stack_fffffffffffffd08,uVar8);
    local_2a1 = false;
    if (bVar4) {
      __n_00 = 2;
      pvVar7 = std::
               vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ::operator[](local_e0,2);
      __n = 3;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_158,3);
      vVar9 = *pvVar6;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_170,__n);
      uVar8 = (uint8_t)(__n >> 0x38);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_50,__n_00);
      local_2a1 = Unit_Test::verifyImage
                            ((Image *)CONCAT44(vVar9,in_stack_fffffffffffffd18),
                             (uint32_t)((ulong)pvVar7 >> 0x20),(uint32_t)pvVar7,
                             (uint32_t)(__n_00 >> 0x20),(uint32_t)__n_00,uVar8);
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)this);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e375d);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  return local_2a1;
}

Assistant:

bool form2_Split(SplitForm2 Split)
    {
        const std::vector < uint8_t > inputIntensity = intensityArray( 3 );
        PenguinV_Image::Image input = uniformRGBImage( inputIntensity[0] );
        fillImage( input, 0, 0, input.width(), input.height(), inputIntensity );

        const std::vector < uint8_t > outputIntensity = intensityArray( 3 );
        std::vector < PenguinV_Image::Image > output;

        std::for_each( outputIntensity.begin(), outputIntensity.end(), [&]( uint8_t value )
        { output.push_back( uniformImage( value ) ); } );

        std::vector < std::pair <uint32_t, uint32_t> > size( 4 );

        size[0] = imageSize( input );
        size[1] = imageSize( output[0] );
        size[2] = imageSize( output[1] );
        size[3] = imageSize( output[2] );

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( size, roiX, roiY, roiWidth, roiHeight );

        Split( input, roiX[0], roiY[0], output[0], roiX[1], roiY[1], output[1], roiX[2], roiY[2], output[2], roiX[3], roiY[3], roiWidth, roiHeight );

        return verifyImage( output[0], roiX[1], roiY[1], roiWidth, roiHeight, inputIntensity[0] ) &&
               verifyImage( output[1], roiX[2], roiY[2], roiWidth, roiHeight, inputIntensity[1] ) &&
               verifyImage( output[2], roiX[3], roiY[3], roiWidth, roiHeight, inputIntensity[2] );
    }